

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<Fad<double>_>::Fill
          (TPZVec<Fad<double>_> *this,Fad<double> *copy,int64_t from,int64_t numelem)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  long lVar5;
  long lVar4;
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar5 = 0;
  if (0 < from) {
    lVar5 = from;
  }
  lVar3 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar3;
  }
  lVar4 = numelem + from;
  if (lVar3 <= numelem + from) {
    lVar4 = lVar3;
  }
  lVar3 = lVar4 - lVar5;
  if (lVar3 != 0 && lVar5 <= lVar4) {
    lVar5 = lVar5 << 5;
    do {
      pdVar1 = (double *)((long)&this->fStore->val_ + lVar5);
      *pdVar1 = copy->val_;
      Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&copy->dx_);
      pdVar1[3] = copy->defaultVal;
      lVar5 = lVar5 + 0x20;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}